

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogMessageCompact.h
# Opt level: O2

void __thiscall
nowtech::log::MessageCompact<8ul,true>::
output<nowtech::log::ConverterCustomText<nowtech::log::MessageCompact<8ul,true>,true,(unsigned_char)100,true,false>>
          (MessageCompact<8ul,true> *this,
          ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)_d_,_true,_false>
          *aConverter)

{
  MessageCompact<8ul,true> aBase;
  MessageCompact<8ul,true> aFill;
  
  if ((byte)this[0xc] - 2 < 0xf) {
    aBase = this[8];
    aFill = this[9];
    switch((uint)(byte)this[0xc]) {
    case 2:
      ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>
      ::convert(aConverter,(bool)((byte)*this & 1),(uint8_t)aBase,(uint8_t)aFill);
      return;
    case 3:
      ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>
      ::convert<void>(aConverter,*(float *)this,(uint8_t)aBase,(uint8_t)aFill);
      return;
    case 4:
      ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>
      ::convert<void>(aConverter,*(double *)this,(uint8_t)aBase,(uint8_t)aFill);
      return;
    case 6:
      ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>
      ::convert(aConverter,(uint8_t)*this,(uint8_t)aBase,(uint8_t)aFill);
      return;
    case 7:
      ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>
      ::convert(aConverter,*(uint16_t *)this,(uint8_t)aBase,(uint8_t)aFill);
      return;
    case 8:
      ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>
      ::convert(aConverter,*(uint32_t *)this,(uint8_t)aBase,(uint8_t)aFill);
      return;
    case 9:
      ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>
      ::convert(aConverter,*(uint64_t *)this,(uint8_t)aBase,(uint8_t)aFill);
      return;
    case 10:
      ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>
      ::convert(aConverter,(int8_t)*this,(uint8_t)aBase,(uint8_t)aFill);
      return;
    case 0xb:
      ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>
      ::convert(aConverter,*(int16_t *)this,(uint8_t)aBase,(uint8_t)aFill);
      return;
    case 0xc:
      ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>
      ::convert(aConverter,*(int32_t *)this,(uint8_t)aBase,(uint8_t)aFill);
      return;
    case 0xd:
      ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>
      ::convert(aConverter,*(int64_t *)this,(uint8_t)aBase,(uint8_t)aFill);
      return;
    case 0xe:
      ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>
      ::convert(aConverter,(char)*this,(uint8_t)aBase,(uint8_t)aFill);
      return;
    case 0xf:
      this = *(MessageCompact<8ul,true> **)this;
    case 0x10:
      ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>
      ::convert(aConverter,(char *)this,(uint8_t)aBase,(uint8_t)aFill);
      return;
    }
  }
  return;
}

Assistant:

void output(tConverter& aConverter) const noexcept {
    Type type = static_cast<Type>(mData[csOffsetType]);
    uint8_t base = mData[csOffsetBase];
    uint8_t fill = mData[csOffsetFill];

    if(type == Type::cBool) {
      bool value;
      std::memcpy(&value, mData + csOffsetPayload, sizeof(value));
      aConverter.convert(value, base, fill);
    }
    else if(type == Type::cUint8_t) {
      aConverter.convert(mData[csOffsetPayload], base, fill);
    }
    else if(type == Type::cUint16_t) {
      uint16_t value;
      std::memcpy(&value, mData + csOffsetPayload, sizeof(value));
      aConverter.convert(value, base, fill);
    }
    else if(type == Type::cUint32_t) {
      uint32_t value;
      std::memcpy(&value, mData + csOffsetPayload, sizeof(value));
      aConverter.convert(value, base, fill);
    }
    else if(type == Type::cInt8_t) {
      int8_t value;
      std::memcpy(&value, mData + csOffsetPayload, sizeof(value));
      aConverter.convert(value, base, fill);
    }
    else if(type == Type::cInt16_t) {
      int16_t value;
      std::memcpy(&value, mData + csOffsetPayload, sizeof(value));
      aConverter.convert(value, base, fill);
    }
    else if(type == Type::cInt32_t) {
      int32_t value;
      std::memcpy(&value, mData + csOffsetPayload, sizeof(value));
      aConverter.convert(value, base, fill);
    }
    else if(type == Type::cChar) {
      char value;
      std::memcpy(&value, mData + csOffsetPayload, sizeof(value));
      aConverter.convert(value, base, fill);
    }
    else if(type == Type::cCharArray) {
      char* value;
      std::memcpy(&value, mData + csOffsetPayload, sizeof(value));
      aConverter.convert(value, base, fill);
    }
    else if(type == Type::cStoredChars) {
      aConverter.convert(reinterpret_cast<char const*>(mData + csOffsetPayload), base, fill);
    }
    else {
      if constexpr(csPayloadSize >= sizeof(int64_t) || sizeof(char*) > sizeof(int32_t)) {
        if(type == Type::cUint64_t) {
          uint64_t value;
          std::memcpy(&value, mData + csOffsetPayload, sizeof(value));
          aConverter.convert(value, base, fill);
        }
        else if(type == Type::cInt64_t) {
          int64_t value;
          std::memcpy(&value, mData + csOffsetPayload, sizeof(value));
          aConverter.convert(value, base, fill);
        }
        else { // nothing to do
        }
      }
      else { // nothing to do
      }
      if constexpr(tSupportFloatingPoint) {
        if(type == Type::cFloat) {
          float value;
          std::memcpy(&value, mData + csOffsetPayload, sizeof(value));
          aConverter.convert(value, base, fill);
        }
        else { // nothing to do
        }
        if constexpr(csPayloadSize >= sizeof(double)) {
          if(type == Type::cDouble) {
            double value;
            std::memcpy(&value, mData + csOffsetPayload, sizeof(value));
            aConverter.convert(value, base, fill);
          }
          else { // nothing to do
          }
          if constexpr(csPayloadSize >= sizeof(long double)) {
            if(type == Type::cLongDouble) {
              long double value;
              std::memcpy(&value, mData + csOffsetPayload, sizeof(value));
              aConverter.convert(value, base, fill);
            }
            else { // nothing to do
            }
          }
          else { // nothing to do
          }
        }
        else { // nothing to do
        }
      }
      else { // nothing to do
      }
    }
  }